

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhKeyCmp(void *pData,sxu32 nLen,void *pUserData)

{
  int iVar1;
  int rc;
  lhash_key_cmp *pCmp;
  void *pUserData_local;
  sxu32 nLen_local;
  void *pData_local;
  
  if (*pUserData < *(ulong *)((long)pUserData + 8)) {
    iVar1 = (**(code **)((long)pUserData + 0x10))(*pUserData,pData,nLen);
    if (iVar1 == 0) {
      *(ulong *)pUserData = *pUserData + (ulong)nLen;
      pData_local._4_4_ = 0;
    }
    else {
      pData_local._4_4_ = -10;
    }
  }
  else if (nLen == 0) {
    pData_local._4_4_ = 0;
  }
  else {
    pData_local._4_4_ = -10;
  }
  return pData_local._4_4_;
}

Assistant:

static int lhKeyCmp(const void *pData,sxu32 nLen,void *pUserData)
{
	struct lhash_key_cmp *pCmp = (struct lhash_key_cmp *)pUserData;
	int rc;
	if( pCmp->zIn >= pCmp->zEnd ){
		if( nLen > 0 ){
			return UNQLITE_ABORT;
		}
		return UNQLITE_OK;
	}
	/* Perform the comparison */
	rc = pCmp->xCmp((const void *)pCmp->zIn,pData,nLen);
	if( rc != 0 ){
		/* Abort comparison */
		return UNQLITE_ABORT;
	}
	/* Advance the cursor */
	pCmp->zIn += nLen;
	return UNQLITE_OK;
}